

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O3

void Ssw_RarTransferPatterns(Ssw_RarMan_t *p,Vec_Int_t *vInits)

{
  uint uVar1;
  int iVar2;
  Ssw_RarPars_t *pSVar3;
  Aig_Man_t *pAVar4;
  double *pdVar5;
  ulong uVar6;
  byte bVar7;
  byte bVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  word *pwVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  
  Ssw_RarTranspose(p);
  pSVar3 = p->pPars;
  iVar11 = pSVar3->nWords;
  if (iVar11 < 1) {
    uVar9 = iVar11 << 6;
  }
  else {
    pwVar12 = p->pPatData;
    uVar6 = (ulong)(uint)p->nGroups;
    iVar13 = 0;
    do {
      if (0 < (int)uVar6) {
        pAVar4 = p->pAig;
        iVar11 = p->nWordsReg;
        lVar14 = 0;
        do {
          if (pAVar4->nRegs / pSVar3->nBinSize <= lVar14) {
            __assert_fail("iBin >= 0 && iBin < Aig_ManRegNum(p->pAig) / p->pPars->nBinSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x4c,"void Ssw_RarAddToBinPat(Ssw_RarMan_t *, int, int)");
          }
          bVar8 = *(byte *)((long)pwVar12 + lVar14 + (long)(iVar11 * iVar13) * 8);
          bVar7 = (byte)pSVar3->nBinSize;
          if (1 << (bVar7 & 0x1f) <= (int)(uint)bVar8) {
            __assert_fail("iPat >= 0 && iPat < (1 << p->pPars->nBinSize)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x4d,"void Ssw_RarAddToBinPat(Ssw_RarMan_t *, int, int)");
          }
          p->pRarity[((int)lVar14 << (bVar7 & 0x1f)) + (uint)bVar8] =
               p->pRarity[((int)lVar14 << (bVar7 & 0x1f)) + (uint)bVar8] + 1;
          lVar14 = lVar14 + 1;
          uVar6 = (ulong)p->nGroups;
        } while (lVar14 < (long)uVar6);
        iVar11 = pSVar3->nWords;
      }
      iVar13 = iVar13 + 1;
      uVar9 = iVar11 * 0x40;
    } while (SBORROW4(iVar13,uVar9) != iVar13 + iVar11 * -0x40 < 0);
  }
  if (0 < (int)uVar9) {
    pwVar12 = p->pPatData;
    iVar13 = p->nWordsReg;
    pdVar5 = p->pPatCosts;
    uVar1 = p->nGroups;
    uVar6 = 0;
    do {
      pdVar5[uVar6] = 0.0;
      if (0 < (int)uVar1) {
        bVar8 = (byte)pSVar3->nBinSize;
        uVar15 = (long)p->pAig->nRegs / (long)pSVar3->nBinSize;
        uVar10 = uVar15 & 0xffffffff;
        if ((int)uVar15 < 1) {
          uVar10 = 0;
        }
        dVar16 = 0.0;
        uVar15 = 0;
        do {
          if (uVar10 == uVar15) {
            __assert_fail("iBin >= 0 && iBin < Aig_ManRegNum(p->pAig) / p->pPars->nBinSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x40,"int Ssw_RarGetBinPat(Ssw_RarMan_t *, int, int)");
          }
          if (1 << (bVar8 & 0x1f) <= (int)(uint)*(byte *)((long)pwVar12 + uVar15)) {
            __assert_fail("iPat >= 0 && iPat < (1 << p->pPars->nBinSize)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x41,"int Ssw_RarGetBinPat(Ssw_RarMan_t *, int, int)");
          }
          iVar2 = p->pRarity
                  [((int)uVar15 << (bVar8 & 0x1f)) + (uint)*(byte *)((long)pwVar12 + uVar15)];
          if (iVar2 < 1) {
            __assert_fail("Value > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                          ,0x349,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
          }
          dVar16 = dVar16 + 1.0 / (double)(iVar2 * iVar2);
          pdVar5[uVar6] = dVar16;
          uVar15 = uVar15 + 1;
        } while (uVar1 != uVar15);
      }
      uVar6 = uVar6 + 1;
      pwVar12 = pwVar12 + iVar13;
    } while (uVar6 != uVar9);
  }
  vInits->nSize = 0;
  if (iVar11 < 1) {
    iVar13 = 0;
  }
  else {
    iVar13 = 0;
    do {
      if (iVar11 < 1) {
LAB_006b5a31:
        __assert_fail("iPatBest >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                      ,0x35e,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
      }
      uVar9 = iVar11 * 0x40;
      uVar6 = 1;
      if (1 < (int)uVar9) {
        uVar6 = (ulong)uVar9;
      }
      uVar15 = 0xffffffff;
      uVar10 = 0;
      dVar16 = -1000000000.0;
      do {
        if (dVar16 < p->pPatCosts[uVar10]) {
          uVar15 = uVar10 & 0xffffffff;
          dVar16 = p->pPatCosts[uVar10];
        }
        uVar10 = uVar10 + 1;
      } while (uVar6 != uVar10);
      iVar11 = (int)uVar15;
      if (iVar11 < 0) goto LAB_006b5a31;
      p->pPatCosts[uVar15] = -1000000000.0;
      if ((int)uVar9 <= iVar11) {
        __assert_fail("Id < 64 * p->pPars->nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                      ,0x54,"word *Ssw_RarPatSim(Ssw_RarMan_t *, int)");
      }
      if (0 < p->pAig->nRegs) {
        iVar2 = p->nWordsReg;
        pwVar12 = p->pPatData;
        uVar6 = 0;
        do {
          Vec_IntPush(vInits,(uint)((*(uint *)((long)pwVar12 +
                                              (uVar6 >> 5) * 4 + (long)iVar11 * (long)iVar2 * 8) >>
                                     ((uint)uVar6 & 0x1f) & 1) != 0));
          uVar9 = (uint)uVar6 + 1;
          uVar6 = (ulong)uVar9;
        } while ((int)uVar9 < p->pAig->nRegs);
      }
      Vec_IntPush(p->vPatBests,iVar11);
      iVar13 = iVar13 + 1;
      iVar11 = p->pPars->nWords;
    } while (iVar13 < iVar11);
    iVar13 = vInits->nSize;
  }
  if (iVar13 == iVar11 * p->pAig->nRegs) {
    return;
  }
  __assert_fail("Vec_IntSize(vInits) == Aig_ManRegNum(p->pAig) * p->pPars->nWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/ssw/sswRarity.c"
                ,0x367,"void Ssw_RarTransferPatterns(Ssw_RarMan_t *, Vec_Int_t *)");
}

Assistant:

static void Ssw_RarTransferPatterns( Ssw_RarMan_t * p, Vec_Int_t * vInits )
{
//    Aig_Obj_t * pObj;
    unsigned char * pData;
    unsigned * pPattern;
    int i, k, Value;

    // more data from regs to pats
    Ssw_RarTranspose( p );

    // update counters
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        pData = (unsigned char *)Ssw_RarPatSim( p, k );
        for ( i = 0; i < p->nGroups; i++ )
            Ssw_RarAddToBinPat( p, i, pData[i] );
    }

    // for each pattern
    for ( k = 0; k < p->pPars->nWords * 64; k++ )
    {
        pData = (unsigned char *)Ssw_RarPatSim( p, k );
        // find the cost of its values
        p->pPatCosts[k] = 0.0;
        for ( i = 0; i < p->nGroups; i++ )
        {
            Value = Ssw_RarGetBinPat( p, i, pData[i] );
            assert( Value > 0 );
            p->pPatCosts[k] += 1.0/(Value*Value);
        }
        // print the result
//Abc_Print( 1, "%3d : %9.6f\n", k, p->pPatCosts[k] );
    }

    // choose as many as there are words
    Vec_IntClear( vInits );
    for ( i = 0; i < p->pPars->nWords; i++ )
    {
        // select the best
        int iPatBest = -1;
        double iCostBest = -ABC_INFINITY;
        for ( k = 0; k < p->pPars->nWords * 64; k++ )
            if ( iCostBest < p->pPatCosts[k] )
            {
                iCostBest = p->pPatCosts[k];
                iPatBest  = k;
            }
        // remove from costs
        assert( iPatBest >= 0 );
        p->pPatCosts[iPatBest] = -ABC_INFINITY;
        // set the flops
        pPattern = (unsigned *)Ssw_RarPatSim( p, iPatBest );
        for ( k = 0; k < Aig_ManRegNum(p->pAig); k++ )
            Vec_IntPush( vInits, Abc_InfoHasBit(pPattern, k) );
//Abc_Print( 1, "Best pattern %5d\n", iPatBest );
        Vec_IntPush( p->vPatBests, iPatBest );
    }
    assert( Vec_IntSize(vInits) == Aig_ManRegNum(p->pAig) * p->pPars->nWords );
}